

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O3

void longvectorN(fft_data *sig,int N,int *array,int tx)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double *pdVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  if (0 < tx) {
    uVar1 = (ulong)(uint)tx;
    uVar10 = 0;
    iVar3 = 0;
    iVar5 = 1;
    do {
      iVar2 = array[uVar1 + ~uVar10];
      iVar6 = iVar2 * iVar5;
      if (0 < iVar5) {
        iVar7 = 0;
        do {
          if (1 < iVar2) {
            pdVar9 = &sig[iVar3].im;
            iVar8 = 0;
            iVar4 = iVar7;
            do {
              iVar8 = iVar8 + 1;
              dVar11 = (double)iVar4 * (-6.283185307179586 / (double)iVar6);
              dVar12 = cos(dVar11);
              ((fft_data *)(pdVar9 + -1))->re = dVar12;
              dVar11 = sin(dVar11);
              *pdVar9 = dVar11;
              iVar2 = array[uVar1 + ~uVar10];
              pdVar9 = pdVar9 + 2;
              iVar4 = iVar4 + iVar7;
            } while (iVar8 < iVar2 + -1);
            iVar3 = iVar3 + iVar8;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 != iVar5);
      }
      uVar10 = uVar10 + 1;
      iVar5 = iVar6;
    } while (uVar10 != uVar1);
  }
  return;
}

Assistant:

void longvectorN(fft_data *sig,int N, int *array, int tx) {
	int L,i,Ls,ct,j,k;
	fft_type theta;
	L = 1;
	ct = 0;
	for (i = 0; i < tx; i++) {
		L = L * array[tx-1-i];
		Ls = L / array[tx-1-i];
		theta = -1.0 * PI2/L;
		for (j = 0; j < Ls;j++) {
			for (k = 0; k < array[tx-1-i] -1 ;k++) {
				sig[ct].re = cos((k+1)*j*theta);
				sig[ct].im = sin((k+1)*j*theta);
				ct++;
			}
		}

	}

}